

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer_scriptpubkeyman.cpp
# Opt level: O0

ExternalSigner * wallet::ExternalSignerScriptPubKeyMan::GetExternalSigner(void)

{
  undefined1 uVar1;
  bool bVar2;
  size_type sVar3;
  runtime_error *prVar4;
  ExternalSigner *in_RDI;
  long in_FS_OFFSET;
  vector<ExternalSigner,_std::allocator<ExternalSigner>_> signers;
  string command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  CChainParams *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *in_stack_fffffffffffffe38;
  ExternalSigner *in_stack_fffffffffffffe40;
  ArgsManager *in_stack_fffffffffffffe48;
  allocator<char> *__a;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 local_16a [32];
  undefined1 local_14a [34];
  string local_128 [64];
  string local_e8 [32];
  string *in_stack_ffffffffffffff38;
  vector<ExternalSigner,_std::allocator<ExternalSigner>_> *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  string local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe58,
             (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
             (allocator<char> *)in_stack_fffffffffffffe48);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
             (allocator<char> *)in_stack_fffffffffffffe48);
  ArgsManager::GetArg(in_stack_fffffffffffffe48,&in_stack_fffffffffffffe40->m_command,
                      in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(in_stack_fffffffffffffe08);
  std::allocator<char>::~allocator((allocator<char> *)local_14a);
  std::__cxx11::string::~string(in_stack_fffffffffffffe08);
  std::allocator<char>::~allocator((allocator<char> *)(local_14a + 1));
  uVar1 = std::operator==(in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10);
  if ((bool)uVar1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    __a = (allocator<char> *)(local_16a + 0x1f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)CONCAT17(uVar1,in_stack_fffffffffffffe50),__a);
    std::operator+(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
    std::runtime_error::runtime_error(prVar4,local_88);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>::vector
              ((vector<ExternalSigner,_std::allocator<ExternalSigner>_> *)in_stack_fffffffffffffe08)
    ;
    Params();
    CChainParams::GetChainTypeString_abi_cxx11_(in_stack_fffffffffffffe10);
    ExternalSigner::Enumerate
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    std::__cxx11::string::~string(in_stack_fffffffffffffe08);
    bVar2 = std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>::empty
                      ((vector<ExternalSigner,_std::allocator<ExternalSigner>_> *)
                       in_stack_fffffffffffffe18);
    if (bVar2) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)CONCAT17(uVar1,in_stack_fffffffffffffe50),
                 (allocator<char> *)in_stack_fffffffffffffe48);
      std::operator+(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
      std::runtime_error::runtime_error(prVar4,local_e8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      sVar3 = std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>::size
                        ((vector<ExternalSigner,_std::allocator<ExternalSigner>_> *)
                         in_stack_fffffffffffffe08);
      if (sVar3 < 2) {
        std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>::operator[]
                  ((vector<ExternalSigner,_std::allocator<ExternalSigner>_> *)
                   in_stack_fffffffffffffe18,(size_type)in_stack_fffffffffffffe10);
        ExternalSigner::ExternalSigner
                  ((ExternalSigner *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>::~vector
                  ((vector<ExternalSigner,_std::allocator<ExternalSigner>_> *)
                   in_stack_fffffffffffffe18);
        std::__cxx11::string::~string(in_stack_fffffffffffffe08);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          return in_RDI;
        }
      }
      else {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16a;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,(char *)CONCAT17(uVar1,in_stack_fffffffffffffe50),
                   (allocator<char> *)in_stack_fffffffffffffe48);
        std::operator+(__lhs,(char *)prVar4);
        std::runtime_error::runtime_error(prVar4,local_128);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

ExternalSigner ExternalSignerScriptPubKeyMan::GetExternalSigner() {
    const std::string command = gArgs.GetArg("-signer", "");
    if (command == "") throw std::runtime_error(std::string(__func__) + ": restart bitcoind with -signer=<cmd>");
    std::vector<ExternalSigner> signers;
    ExternalSigner::Enumerate(command, signers, Params().GetChainTypeString());
    if (signers.empty()) throw std::runtime_error(std::string(__func__) + ": No external signers found");
    // TODO: add fingerprint argument instead of failing in case of multiple signers.
    if (signers.size() > 1) throw std::runtime_error(std::string(__func__) + ": More than one external signer found. Please connect only one at a time.");
    return signers[0];
}